

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

wstring * __thiscall
Centaurus::readwcsfromfile_abi_cxx11_
          (wstring *__return_storage_ptr__,Centaurus *this,char *filename)

{
  istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> __beg;
  istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> __end;
  allocator<wchar_t> local_241;
  undefined1 local_240 [12];
  undefined1 local_230 [12];
  istream_type local_220 [8];
  wifstream ifs;
  char *filename_local;
  
  std::wifstream::wifstream(local_220,(char *)this,_S_in);
  std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::istreambuf_iterator
            ((istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)local_230,local_220);
  std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::istreambuf_iterator
            ((istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)local_240);
  std::allocator<wchar_t>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_230._0_8_;
  __beg._M_c = local_230._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_240._0_8_;
  __end._M_c = local_240._8_4_;
  std::__cxx11::wstring::wstring<std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)__return_storage_ptr__,__beg,__end,&local_241);
  std::allocator<wchar_t>::~allocator(&local_241);
  std::wifstream::~wifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::wstring readwcsfromfile(const char *filename)
{
	std::wifstream ifs(filename);

	return std::wstring(std::istreambuf_iterator<wchar_t>(ifs), {});
}